

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffob(bifcxdef *ctx,int argc)

{
  long lVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  voccxdef *voc;
  objnum cls;
  int j;
  int i;
  objnum obj;
  vocidef **v;
  vocidef ***vpg;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  voccxdef *voc_00;
  undefined2 in_stack_ffffffffffffffd0;
  ushort uVar3;
  int iVar4;
  int local_28;
  vocidef **local_20;
  vocidef ***local_18;
  
  voc_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  if (in_ESI == 0) {
    uVar3 = 0xffff;
  }
  else {
    if (in_ESI != 1) {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffbc);
    }
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x02') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffbc);
    }
    uVar3 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    in_stack_ffffffffffffffc4 = (uint)uVar3;
  }
  local_18 = voc_00->voccxinh;
  local_28 = 0;
  do {
    if (0x7f < local_28) {
      runpnil((runcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      return;
    }
    if (*local_18 != (vocidef **)0x0) {
      local_20 = *local_18;
      for (iVar4 = 0; iVar4 < 0x100; iVar4 = iVar4 + 1) {
        if (((*local_20 != (vocidef *)0x0) && ((((*local_20)->vociu).vocius.vociusflg & 1) == 0)) &&
           ((uVar3 == 0xffff ||
            (iVar2 = bifinh(voc_00,(vocidef *)
                                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (objnum)((uint)in_stack_ffffffffffffffbc >> 0x10)), iVar2 != 0)))) {
          runpobj((runcxdef *)CONCAT44(iVar4,CONCAT22(uVar3,in_stack_ffffffffffffffd0)),
                  (objnum)((ulong)voc_00 >> 0x30));
          return;
        }
        local_20 = local_20 + 1;
      }
    }
    local_18 = local_18 + 1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void biffob(bifcxdef *ctx, int argc)
{
    vocidef ***vpg;
    vocidef  **v;
    objnum     obj;
    int        i;
    int        j;
    objnum     cls;
    voccxdef  *voc = ctx->bifcxrun->runcxvoc;

    /* get class to search for, if one is specified */
    if (argc == 0)
        cls = MCMONINV;
    else if (argc == 1)
        cls = runpopobj(ctx->bifcxrun);
    else
        runsig(ctx->bifcxrun, ERR_BIFARGC);
    
    for (vpg = voc->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (!*v || ((*v)->vociflg & VOCIFCLASS)
                || (cls != MCMONINV && !bifinh(voc, *v, cls)))
                continue;
            
            /* this is an object we can use - push it */
            runpobj(ctx->bifcxrun, obj);
            return;
        }
    }
    
    /* no objects found at all - return nil */
    runpnil(ctx->bifcxrun);
}